

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cws.c
# Opt level: O3

void nn_cws_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  nn_fsm *in_RAX;
  nn_fsm *pnVar2;
  
  if (type == -3 && src == -2) {
LAB_0012ecef:
    nn_cws_shutdown_cold_2();
    pnVar2 = in_RAX;
  }
  else {
    pnVar2 = self + 1;
    if (*(int *)&self[1].fn == 0xb) goto LAB_0012ed38;
    if (*(int *)&self[1].fn != 10) {
      nn_cws_shutdown_cold_1();
      goto LAB_0012ecef;
    }
  }
  iVar1 = nn_sws_isidle((nn_sws *)(self + 0xb));
  if (iVar1 == 0) {
    return;
  }
  nn_backoff_stop((nn_backoff *)&self[8].shutdown_fn);
  nn_usock_stop((nn_usock *)&self[1].state);
  nn_dns_stop((nn_dns *)&self[0x52].stopped.item);
  *(undefined4 *)&pnVar2->fn = 0xb;
LAB_0012ed38:
  iVar1 = nn_backoff_isidle((nn_backoff *)&self[8].shutdown_fn);
  if (((iVar1 != 0) && (iVar1 = nn_usock_isidle((nn_usock *)&self[1].state), iVar1 != 0)) &&
     (iVar1 = nn_dns_isidle((nn_dns *)&self[0x52].stopped.item), iVar1 != 0)) {
    *(undefined4 *)&pnVar2->fn = 1;
    nn_fsm_stopped_noevent(self);
    nn_ep_stopped((nn_ep *)self[1].shutdown_fn);
    return;
  }
  return;
}

Assistant:

static void nn_cws_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_cws *cws;

    cws = nn_cont (self, struct nn_cws, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        if (!nn_sws_isidle (&cws->sws)) {
            nn_ep_stat_increment (cws->ep, NN_STAT_DROPPED_CONNECTIONS, 1);
            nn_sws_stop (&cws->sws);
        }
        cws->state = NN_CWS_STATE_STOPPING_SWS_FINAL;
    }
    if (nn_slow (cws->state == NN_CWS_STATE_STOPPING_SWS_FINAL)) {
        if (!nn_sws_isidle (&cws->sws))
            return;
        nn_backoff_stop (&cws->retry);
        nn_usock_stop (&cws->usock);
        nn_dns_stop (&cws->dns);
        cws->state = NN_CWS_STATE_STOPPING;
    }
    if (nn_slow (cws->state == NN_CWS_STATE_STOPPING)) {
        if (!nn_backoff_isidle (&cws->retry) ||
              !nn_usock_isidle (&cws->usock) ||
              !nn_dns_isidle (&cws->dns))
            return;
        cws->state = NN_CWS_STATE_IDLE;
        nn_fsm_stopped_noevent (&cws->fsm);
        nn_ep_stopped (cws->ep);
        return;
    }

    nn_fsm_bad_state (cws->state, src, type);
}